

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_226::GlobalTypeOptimization::removeFieldsInInstructions::FieldRemover::create
          (FieldRemover *this)

{
  undefined1 local_20 [16];
  FieldRemover *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::FieldRemover,wasm::(anonymous_namespace)::GlobalTypeOptimization&>
            ((GlobalTypeOptimization *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::FieldRemover,std::default_delete<wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::FieldRemover>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<FieldRemover,_std::default_delete<FieldRemover>_> *)local_20);
  std::unique_ptr<FieldRemover,_std::default_delete<FieldRemover>_>::~unique_ptr
            ((unique_ptr<FieldRemover,_std::default_delete<FieldRemover>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<FieldRemover>(parent);
      }